

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

Instr * LinearScan::InsertLea(RegOpnd *dst,Opnd *src,Instr *insertBeforeInstr)

{
  Instr *pIVar1;
  Instr *local_58;
  Instr *instr;
  Instr *instrRet;
  AutoRestoreLegalize restore;
  Instr *instrPrev;
  Instr *insertBeforeInstr_local;
  Opnd *src_local;
  RegOpnd *dst_local;
  
  restore._8_8_ = insertBeforeInstr->m_prev;
  AutoRestoreLegalize::AutoRestoreLegalize
            ((AutoRestoreLegalize *)&instrRet,insertBeforeInstr->m_func,true);
  pIVar1 = Lowerer::InsertLea(dst,src,insertBeforeInstr);
  for (local_58 = *(Instr **)(restore._8_8_ + 0x10); local_58 != insertBeforeInstr;
      local_58 = local_58->m_next) {
    IR::Instr::CopyNumber(local_58,insertBeforeInstr);
  }
  AutoRestoreLegalize::~AutoRestoreLegalize((AutoRestoreLegalize *)&instrRet);
  return pIVar1;
}

Assistant:

IR::Instr* LinearScan::InsertLea(IR::RegOpnd *dst, IR::Opnd *src, IR::Instr *const insertBeforeInstr)
{
    IR::Instr *instrPrev = insertBeforeInstr->m_prev;

    AutoRestoreLegalize restore(insertBeforeInstr->m_func, true);
    IR::Instr *instrRet = Lowerer::InsertLea(dst, src, insertBeforeInstr);

    for (IR::Instr *instr = instrPrev->m_next; instr != insertBeforeInstr; instr = instr->m_next)
    {
        instr->CopyNumber(insertBeforeInstr);
    }

    return instrRet;
}